

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O0

symbol * evaluate_alignof(dmr_C *C,expression *expr)

{
  symbol *psVar1;
  symbol *type;
  expression *expr_local;
  dmr_C *C_local;
  
  psVar1 = evaluate_type_information(C,expr);
  if (psVar1 == (symbol *)0x0) {
    C_local = (dmr_C *)0x0;
  }
  else {
    *(ushort *)expr = *(ushort *)expr & 0xff00 | 1;
    (expr->field_5).field_0.value = (psVar1->field_14).field_2.ctype.alignment;
    (expr->field_5).field_0.taint = 0;
    expr->ctype = C->target->size_t_ctype;
    C_local = (dmr_C *)C->target->size_t_ctype;
  }
  return (symbol *)C_local;
}

Assistant:

static struct symbol *evaluate_alignof(struct dmr_C *C, struct expression *expr)
{
	struct symbol *type;

	type = evaluate_type_information(C, expr);
	if (!type)
		return NULL;

	expr->type = EXPR_VALUE;
	expr->value = type->ctype.alignment;
	expr->taint = 0;
	expr->ctype = C->target->size_t_ctype;
	return C->target->size_t_ctype;
}